

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_qemu_ld_i64_mipsel
               (TCGContext_conflict4 *tcg_ctx,TCGv_i64 val,TCGv_i32 addr,TCGArg idx,
               MemOp_conflict2 memop)

{
  MemOp_conflict2 memop_00;
  MemOp_conflict2 orig_memop;
  MemOp_conflict2 memop_local;
  TCGArg idx_local;
  TCGv_i32 addr_local;
  TCGv_i64 val_local;
  TCGContext_conflict4 *tcg_ctx_local;
  
  tcg_gen_req_mo(tcg_ctx,TCG_MO_ST_LD|TCG_MO_LD_LD);
  memop_00 = tcg_canonicalize_memop(memop,true,false);
  gen_ldst_i64(tcg_ctx,INDEX_op_qemu_ld_i64,val,addr,memop_00,idx);
  check_exit_request_mipsel(tcg_ctx);
  return;
}

Assistant:

void tcg_gen_qemu_ld_i64(TCGContext *tcg_ctx, TCGv_i64 val, TCGv addr, TCGArg idx, MemOp memop)
{
    MemOp orig_memop;

#if TCG_TARGET_REG_BITS == 32
    if ((memop & MO_SIZE) < MO_64) {
        tcg_gen_qemu_ld_i32(tcg_ctx, TCGV_LOW(tcg_ctx, val), addr, idx, memop);
        if (memop & MO_SIGN) {
            tcg_gen_sari_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, val), TCGV_LOW(tcg_ctx, val), 31);
        } else {
            tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, val), 0);
        }
        check_exit_request(tcg_ctx);
        return;
    }
#endif

    tcg_gen_req_mo(tcg_ctx, TCG_MO_LD_LD | TCG_MO_ST_LD);
    memop = tcg_canonicalize_memop(memop, 1, 0);

    orig_memop = memop;
#if !TCG_TARGET_HAS_MEMORY_BSWAP
    if (memop & MO_BSWAP) {
        memop &= ~MO_BSWAP;
        /* The bswap primitive requires zero-extended input.  */
        if ((memop & MO_SIGN) && (memop & MO_SIZE) < MO_64) {
            memop &= ~MO_SIGN;
        }
    }
#endif

    gen_ldst_i64(tcg_ctx, INDEX_op_qemu_ld_i64, val, addr, memop, idx);

    if ((orig_memop ^ memop) & MO_BSWAP) {
        switch (orig_memop & MO_SIZE) {
        case MO_16:
            tcg_gen_bswap16_i64(tcg_ctx, val, val);
            if (orig_memop & MO_SIGN) {
                tcg_gen_ext16s_i64(tcg_ctx, val, val);
            }
            break;
        case MO_32:
            tcg_gen_bswap32_i64(tcg_ctx, val, val);
            if (orig_memop & MO_SIGN) {
                tcg_gen_ext32s_i64(tcg_ctx, val, val);
            }
            break;
        case MO_64:
            tcg_gen_bswap64_i64(tcg_ctx, val, val);
            break;
        default:
            g_assert_not_reached();
        }
    }
    check_exit_request(tcg_ctx);
}